

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O0

Path<lemon::SmartDigraph> * __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::negativeCycle(BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  Reference pvVar4;
  const_reference pvVar5;
  Value *this_00;
  undefined8 *in_RSI;
  Path<lemon::SmartDigraph> *in_RDI;
  Node u;
  Node v;
  int i;
  NodeMap<int> state;
  Path<lemon::SmartDigraph> *cycle;
  SmartDigraphBase *in_stack_fffffffffffffef8;
  Path<lemon::SmartDigraph> *in_stack_ffffffffffffff00;
  Node in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
  *in_stack_ffffffffffffff10;
  Node local_68 [2];
  Arc local_60;
  Node local_5c;
  int local_58;
  undefined1 local_45;
  undefined4 local_44;
  
  local_44 = 0xffffffff;
  DigraphExtender<lemon::SmartDigraphBase>::NodeMap<int>::NodeMap
            ((NodeMap<int> *)in_stack_ffffffffffffff10,
             (Digraph *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08._id),
             (int *)in_stack_ffffffffffffff00);
  local_45 = 0;
  Path<lemon::SmartDigraph>::Path(in_stack_ffffffffffffff00);
  local_58 = 0;
  do {
    iVar1 = local_58;
    sVar3 = std::
            vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
            size((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                  *)(in_RSI + 7));
    if ((int)sVar3 <= iVar1) {
LAB_002c4800:
      local_45 = 1;
      DigraphExtender<lemon::SmartDigraphBase>::NodeMap<int>::~NodeMap((NodeMap<int> *)0x2c4821);
      return in_RDI;
    }
    std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
    operator[]((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                *)(in_RSI + 7),(long)local_58);
    pvVar4 = VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
             ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
                           *)in_stack_ffffffffffffff00,(Key *)in_stack_fffffffffffffef8);
    if (*pvVar4 == -1) {
      pvVar5 = std::
               vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               ::operator[]((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                             *)(in_RSI + 7),(long)local_58);
      local_5c._id = pvVar5->_id;
      while( true ) {
        this_00 = ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                  ::operator[](in_stack_ffffffffffffff10,
                               (Key *)CONCAT44(in_stack_ffffffffffffff0c,
                                               in_stack_ffffffffffffff08._id));
        SmartDigraphBase::Arc::Arc(&local_60);
        bVar2 = SmartDigraphBase::Arc::operator!=(this_00,local_60);
        if (!bVar2) break;
        pvVar4 = VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
                 ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
                               *)in_stack_ffffffffffffff00,(Key *)in_stack_fffffffffffffef8);
        if (*pvVar4 == local_58) {
          ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
          ::operator[](in_stack_ffffffffffffff10,
                       (Key *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08._id));
          Path<lemon::SmartDigraph>::addFront
                    (in_stack_ffffffffffffff00,(Arc *)in_stack_fffffffffffffef8);
          ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
          ::operator[](in_stack_ffffffffffffff10,
                       (Key *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08._id));
          local_68[0] = SmartDigraphBase::source
                                  (in_stack_fffffffffffffef8,(int)in_stack_ffffffffffffff00);
          while (bVar2 = SmartDigraphBase::Node::operator!=(local_68,local_5c), bVar2) {
            ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
            ::operator[](in_stack_ffffffffffffff10,
                         (Key *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08._id));
            Path<lemon::SmartDigraph>::addFront
                      (in_stack_ffffffffffffff00,(Arc *)in_stack_fffffffffffffef8);
            ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
            ::operator[](in_stack_ffffffffffffff10,
                         (Key *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08._id));
            local_68[0] = SmartDigraphBase::source
                                    (in_stack_fffffffffffffef8,(int)in_stack_ffffffffffffff00);
          }
          goto LAB_002c4800;
        }
        pvVar4 = VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
                 ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
                               *)in_stack_ffffffffffffff00,(Key *)in_stack_fffffffffffffef8);
        if (-1 < *pvVar4) break;
        in_stack_ffffffffffffff0c = local_58;
        in_stack_ffffffffffffff10 =
             (ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
              *)VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
                ::operator[]((VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
                              *)in_stack_ffffffffffffff00,(Key *)in_stack_fffffffffffffef8);
        *(int *)&(in_stack_ffffffffffffff10->super_ObserverBase)._vptr_ObserverBase =
             in_stack_ffffffffffffff0c;
        in_stack_ffffffffffffff00 = (Path<lemon::SmartDigraph> *)*in_RSI;
        ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
        ::operator[](in_stack_ffffffffffffff10,
                     (Key *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08._id));
        in_stack_ffffffffffffff08 =
             SmartDigraphBase::source(in_stack_fffffffffffffef8,(int)in_stack_ffffffffffffff00);
        local_5c = in_stack_ffffffffffffff08;
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

lemon::Path<Digraph> negativeCycle() const {
    typename Digraph::template NodeMap<int> state(*_gr, -1);
    lemon::Path<Digraph>                    cycle;
    for (int i = 0; i < int(_process.size()); ++i) {
      if (state[_process[i]] != -1)
        continue;
      for (Node v = _process[i]; (*_pred)[v] != INVALID;
           v      = _gr->source((*_pred)[v])) {
        if (state[v] == i) {
          cycle.addFront((*_pred)[v]);
          for (Node u = _gr->source((*_pred)[v]); u != v;
               u      = _gr->source((*_pred)[u])) {
            cycle.addFront((*_pred)[u]);
          }
          return cycle;
        } else if (state[v] >= 0) {
          break;
        }
        state[v] = i;
      }
    }
    return cycle;
  }